

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiContext * ImGui::CreateContext(ImFontAtlas *shared_font_atlas)

{
  ImGuiContext *pIVar1;
  ImGuiContext *this;
  
  pIVar1 = GImGui;
  this = (ImGuiContext *)MemAlloc(0x5678);
  ImGuiContext::ImGuiContext(this,shared_font_atlas);
  GImGui = this;
  Initialize();
  if (pIVar1 != (ImGuiContext *)0x0) {
    GImGui = pIVar1;
  }
  return this;
}

Assistant:

ImGuiContext* ImGui::CreateContext(ImFontAtlas* shared_font_atlas)
{
    ImGuiContext* prev_ctx = GetCurrentContext();
    ImGuiContext* ctx = IM_NEW(ImGuiContext)(shared_font_atlas);
    SetCurrentContext(ctx);
    Initialize();
    if (prev_ctx != NULL)
        SetCurrentContext(prev_ctx); // Restore previous context if any, else keep new one.
    return ctx;
}